

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O3

void __thiscall VDasher::moveTo(VDasher *this,VPointF *p)

{
  size_t sVar1;
  ulong uVar2;
  Dash *pDVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  
  this->mDiscard = false;
  this->mStartNewSegment = true;
  this->mCurPt = *p;
  this->mIndex = 0;
  if (1e-06 <= ABS(this->mDashOffset)) {
    sVar1 = this->mArraySize;
    if (sVar1 == 0) {
      fVar6 = 0.0;
    }
    else {
      fVar6 = this->mDashArray[sVar1 - 1].length + this->mDashArray[sVar1 - 1].gap;
    }
    fVar5 = fmodf(this->mDashOffset,fVar6);
    if (this->mArraySize != 0) {
      fVar6 = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar5 |
                     (uint)(fVar6 + fVar5) & -(uint)(fVar5 < 0.0));
      sVar1 = 0;
      do {
        fVar5 = this->mDashArray[sVar1].length;
        if (fVar6 < fVar5) {
          this->mIndex = sVar1;
          this->mCurrentLength = fVar5 - fVar6;
          this->mDiscard = false;
          break;
        }
        fVar6 = fVar6 - fVar5;
        fVar5 = this->mDashArray[sVar1].gap;
        if (fVar6 < fVar5) {
          this->mIndex = sVar1;
          this->mCurrentLength = fVar5 - fVar6;
          this->mDiscard = true;
          break;
        }
        fVar6 = fVar6 - fVar5;
        sVar1 = sVar1 + 1;
      } while (this->mArraySize != sVar1);
    }
  }
  else {
    this->mCurrentLength = this->mDashArray->length;
  }
  if (ABS(this->mCurrentLength) <= 1e-06) {
    bVar4 = this->mDiscard;
    uVar2 = this->mIndex;
    do {
      bVar4 = (bVar4 & 1) == 0;
      if ((bool)bVar4) {
        pDVar3 = (Dash *)&this->mDashArray[uVar2].gap;
      }
      else {
        uVar2 = (uVar2 + 1) % this->mArraySize;
        this->mIndex = uVar2;
        pDVar3 = this->mDashArray + uVar2;
      }
      fVar6 = pDVar3->length;
      this->mCurrentLength = fVar6;
    } while (ABS(fVar6) <= 1e-06);
    this->mDiscard = (bool)bVar4;
    this->mStartNewSegment = true;
  }
  return;
}

Assistant:

void VDasher::moveTo(const VPointF &p)
{
    mDiscard = false;
    mStartNewSegment = true;
    mCurPt = p;
    mIndex = 0;

    if (!vCompare(mDashOffset, 0.0f)) {
        float totalLength = 0.0;
        for (size_t i = 0; i < mArraySize; i++) {
            totalLength = mDashArray[i].length + mDashArray[i].gap;
        }
        float normalizeLen = std::fmod(mDashOffset, totalLength);
        if (normalizeLen < 0.0f) {
            normalizeLen = totalLength + normalizeLen;
        }
        // now the length is less than total length and +ve
        // findout the current dash index , dashlength and gap.
        for (size_t i = 0; i < mArraySize; i++) {
            if (normalizeLen < mDashArray[i].length) {
                mIndex = i;
                mCurrentLength = mDashArray[i].length - normalizeLen;
                mDiscard = false;
                break;
            }
            normalizeLen -= mDashArray[i].length;
            if (normalizeLen < mDashArray[i].gap) {
                mIndex = i;
                mCurrentLength = mDashArray[i].gap - normalizeLen;
                mDiscard = true;
                break;
            }
            normalizeLen -= mDashArray[i].gap;
        }
    } else {
        mCurrentLength = mDashArray[mIndex].length;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}